

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.c
# Opt level: O2

void statemachine_definition_populate
               (statemachine_definition *def,int **transition_table,char **state_names)

{
  uint __line;
  char *__assertion;
  
  if (def == (statemachine_definition *)0x0) {
    __assertion = "def != NULL";
    __line = 0x3e;
  }
  else {
    if (transition_table != (int **)0x0) {
      def->transition_table = transition_table;
      def->state_names = state_names;
      return;
    }
    __assertion = "transition_table != NULL";
    __line = 0x3f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/build_O2/src/tests/statemachine.c"
                ,__line,
                "void statemachine_definition_populate(statemachine_definition *, const int *const *, const char *const *)"
               );
}

Assistant:

void statemachine_definition_populate(statemachine_definition *def,
                                      const int* const* transition_table,
                                      const char* const* state_names)
{
  assert(def != NULL);
  assert(transition_table != NULL);

  def->transition_table = transition_table;

  def->state_names = state_names;
}